

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O2

utf8proc_bool grapheme_break_extended(int lbc,int tbc,utf8proc_int32_t *state)

{
  int iVar1;
  utf8proc_bool uVar2;
  uint uVar3;
  
  if (((state == (utf8proc_int32_t *)0x0) || (uVar3 = *state, *state == 0)) &&
     (uVar3 = lbc, lbc == 0)) {
    uVar2 = true;
  }
  else {
    if (tbc == 3 && uVar3 == 2) goto LAB_0011b2de;
    uVar2 = true;
    if (2 < tbc - 2U && 2 < uVar3 - 2) {
      if ((uVar3 == 9) || (uVar3 == 7)) {
        if (1 < tbc - 7U) goto LAB_0011b365;
      }
      else if (((uVar3 != 6) || (4 < tbc - 6U)) || ((0x1bU >> (tbc - 6U & 0x1f) & 1) == 0)) {
LAB_0011b365:
        uVar2 = false;
        if ((uVar3 == 0xd) || (tbc == 8 && (uVar3 & 0xfffffffd) == 8)) goto LAB_0011b31f;
        if ((0xe < (uint)tbc) || ((0x5020U >> (tbc & 0x1fU) & 1) == 0)) {
          if (((tbc != 0x10) || (uVar3 != 0xf && uVar3 != 0x12)) &&
             (1 < tbc - 0x11U || uVar3 != 0xe)) {
            uVar2 = tbc != 0xb || uVar3 != 0xb;
            goto LAB_0011b31f;
          }
        }
      }
LAB_0011b2de:
      uVar2 = false;
    }
  }
LAB_0011b31f:
  if (state == (utf8proc_int32_t *)0x0) {
    return uVar2;
  }
  iVar1 = *state;
  if (iVar1 == 0xb && tbc == 0xb) {
    tbc = 1;
  }
  else {
    if (iVar1 == 0xf) {
      if (tbc != 5) goto LAB_0011b356;
    }
    else if (tbc != 5 || iVar1 != 0x12) goto LAB_0011b356;
    tbc = 0xf;
  }
LAB_0011b356:
  *state = tbc;
  return uVar2;
}

Assistant:

static utf8proc_bool grapheme_break_extended(int lbc, int tbc, utf8proc_int32_t *state)
{
  int lbc_override = ((state && *state != UTF8PROC_BOUNDCLASS_START)
                      ? *state : lbc);
  utf8proc_bool break_permitted = grapheme_break_simple(lbc_override, tbc);
  if (state) {
    // Special support for GB 12/13 made possible by GB999. After two RI
    // class codepoints we want to force a break. Do this by resetting the
    // second RI's bound class to UTF8PROC_BOUNDCLASS_OTHER, to force a break
    // after that character according to GB999 (unless of course such a break is
    // forbidden by a different rule such as GB9).
    if (*state == tbc && tbc == UTF8PROC_BOUNDCLASS_REGIONAL_INDICATOR)
      *state = UTF8PROC_BOUNDCLASS_OTHER;
    // Special support for GB10. Fold any EXTEND codepoints into the previous
    // boundclass if we're dealing with an emoji base boundclass.
    else if ((*state == UTF8PROC_BOUNDCLASS_E_BASE      ||
              *state == UTF8PROC_BOUNDCLASS_E_BASE_GAZ) &&
             tbc == UTF8PROC_BOUNDCLASS_EXTEND)
      *state = UTF8PROC_BOUNDCLASS_E_BASE;
    else
      *state = tbc;
  }
  return break_permitted;
}